

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

double __thiscall S1Interval::GetDirectedHausdorffDistance(S1Interval *this,S1Interval *y)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_38;
  double local_28;
  undefined8 uStack_20;
  
  bVar2 = Contains(y,this);
  dVar4 = 0.0;
  if (!bVar2) {
    dVar4 = (y->bounds_).c_[0];
    if ((((dVar4 != 3.141592653589793) || (NAN(dVar4))) ||
        (dVar1 = (y->bounds_).c_[1], dVar1 != -3.141592653589793)) ||
       (dVar4 = 3.141592653589793, NAN(dVar1))) {
      dVar4 = GetComplementCenter(y);
      bVar2 = Contains(this,dVar4);
      if (bVar2) {
        dVar1 = (y->bounds_).c_[1];
        dVar5 = dVar4 - dVar1;
        uVar3 = -(ulong)(dVar5 < 0.0);
        dVar4 = (double)(~uVar3 & (ulong)dVar5 |
                        (ulong)((dVar4 + 3.141592653589793) - (dVar1 + -3.141592653589793)) & uVar3)
        ;
      }
      else {
        S1Interval((S1Interval *)&local_38,(y->bounds_).c_[1],dVar4);
        bVar2 = Contains((S1Interval *)&local_38,(this->bounds_).c_[1]);
        local_28 = 0.0;
        if (bVar2) {
          dVar1 = (y->bounds_).c_[1];
          dVar5 = (this->bounds_).c_[1];
          dVar6 = dVar5 - dVar1;
          uVar3 = -(ulong)(dVar6 < 0.0);
          local_28 = (double)(~uVar3 & (ulong)dVar6 |
                             (ulong)((dVar5 + 3.141592653589793) - (dVar1 + -3.141592653589793)) &
                             uVar3);
        }
        uStack_20 = 0;
        S1Interval((S1Interval *)&local_38,dVar4,(y->bounds_).c_[0]);
        bVar2 = Contains((S1Interval *)&local_38,(this->bounds_).c_[0]);
        dVar4 = 0.0;
        if (bVar2) {
          dVar4 = (this->bounds_).c_[0];
          dVar1 = (y->bounds_).c_[0];
          dVar5 = dVar1 - dVar4;
          uVar3 = -(ulong)(dVar5 < 0.0);
          dVar4 = (double)(~uVar3 & (ulong)dVar5 |
                          (ulong)((dVar1 + 3.141592653589793) - (dVar4 + -3.141592653589793)) &
                          uVar3);
        }
        if ((local_28 <= 0.0) && (dVar4 <= 0.0)) {
          S2LogMessage::S2LogMessage
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
                     ,0x9f,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_38.stream_,"Check failed: hi_hi > 0 || lo_lo > 0 ");
          abort();
        }
        if (dVar4 <= local_28) {
          dVar4 = local_28;
        }
      }
    }
  }
  return dVar4;
}

Assistant:

double S1Interval::GetDirectedHausdorffDistance(const S1Interval& y) const {
  if (y.Contains(*this)) return 0.0;  // this includes the case *this is empty
  if (y.is_empty()) return M_PI;  // maximum possible distance on S1

  double y_complement_center = y.GetComplementCenter();
  if (Contains(y_complement_center)) {
    return PositiveDistance(y.hi(), y_complement_center);
  } else {
    // The Hausdorff distance is realized by either two hi() endpoints or two
    // lo() endpoints, whichever is farther apart.
    double hi_hi = S1Interval(y.hi(), y_complement_center).Contains(hi()) ?
        PositiveDistance(y.hi(), hi()) : 0;
    double lo_lo = S1Interval(y_complement_center, y.lo()).Contains(lo()) ?
        PositiveDistance(lo(), y.lo()) : 0;
    S2_DCHECK(hi_hi > 0 || lo_lo > 0);
    return max(hi_hi, lo_lo);
  }
}